

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::DeadBranchElimPass::AddBranch
          (DeadBranchElimPass *this,uint32_t labelId,BasicBlock *bp)

{
  IRContext *c;
  DefUseManager *this_00;
  Instruction *pIVar1;
  initializer_list<unsigned_int> init_list;
  uint32_t local_a4 [3];
  SmallVector<unsigned_int,_2UL> local_98;
  SmallVector<unsigned_int,_2UL> local_70;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  this_00 = Pass::get_def_use_mgr((Pass *)this);
  pIVar1 = analysis::DefUseManager::GetDef(this_00,labelId);
  if (pIVar1 != (Instruction *)0x0) {
    pIVar1 = (Instruction *)::operator_new(0x70);
    c = (this->super_MemPass).super_Pass.context_;
    init_list._M_len = 1;
    init_list._M_array = local_a4;
    local_a4[0] = labelId;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_70,init_list);
    local_a4[1] = 1;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_98,&local_70);
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    _M_range_initialize<spvtools::opt::Operand_const*>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
               local_a4 + 1,&local_70);
    Instruction::Instruction(pIVar1,c,OpBranch,0,0,(OperandList *)&local_48);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_48)
    ;
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_98);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_70);
    IRContext::AnalyzeDefUse((this->super_MemPass).super_Pass.context_,pIVar1);
    IRContext::set_instr_block((this->super_MemPass).super_Pass.context_,pIVar1,bp);
    utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
              ((IntrusiveNodeBase<spvtools::opt::Instruction> *)pIVar1,
               &(bp->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_);
    return;
  }
  __assert_fail("get_def_use_mgr()->GetDef(labelId) != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dead_branch_elim_pass.cpp"
                ,0x4e,"void spvtools::opt::DeadBranchElimPass::AddBranch(uint32_t, BasicBlock *)");
}

Assistant:

void DeadBranchElimPass::AddBranch(uint32_t labelId, BasicBlock* bp) {
  assert(get_def_use_mgr()->GetDef(labelId) != nullptr);
  std::unique_ptr<Instruction> newBranch(
      new Instruction(context(), spv::Op::OpBranch, 0, 0,
                      {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {labelId}}}));
  context()->AnalyzeDefUse(&*newBranch);
  context()->set_instr_block(&*newBranch, bp);
  bp->AddInstruction(std::move(newBranch));
}